

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

char_int_type __thiscall
nlohmann::json_abi_v3_11_2::detail::
lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::get(lexer<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::json_abi_v3_11_2::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      *this)

{
  int_type iVar1;
  iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__x;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  in_RDI[2].current._M_current = in_RDI[2].current._M_current + 1;
  in_RDI[2].end._M_current = in_RDI[2].end._M_current + 1;
  if (((ulong)in_RDI[1].end._M_current & 1) == 0) {
    iVar1 = iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_character(in_RDI);
    *(int_type *)((long)&in_RDI[1].current._M_current + 4) = iVar1;
  }
  else {
    *(undefined1 *)&in_RDI[1].end._M_current = 0;
  }
  iVar2 = *(int *)((long)&in_RDI[1].current._M_current + 4);
  iVar1 = std::char_traits<char>::eof();
  if (iVar2 != iVar1) {
    __x = &in_RDI[3].end;
    std::char_traits<char>::to_char_type((int_type *)((long)&in_RDI[1].current._M_current + 4));
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               (value_type *)__x);
  }
  if (*(int *)((long)&in_RDI[1].current._M_current + 4) == 10) {
    in_RDI[3].current._M_current = in_RDI[3].current._M_current + 1;
    in_RDI[2].end._M_current = (char *)0x0;
  }
  return *(char_int_type *)((long)&in_RDI[1].current._M_current + 4);
}

Assistant:

char_int_type get()
    {
        ++position.chars_read_total;
        ++position.chars_read_current_line;

        if (next_unget)
        {
            // just reset the next_unget variable and work with current
            next_unget = false;
        }
        else
        {
            current = ia.get_character();
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char_type>::eof()))
        {
            token_string.push_back(std::char_traits<char_type>::to_char_type(current));
        }

        if (current == '\n')
        {
            ++position.lines_read;
            position.chars_read_current_line = 0;
        }

        return current;
    }